

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void RenderArrow(ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,ImGuiDir direction,ImU32 col)

{
  ImVec2 local_18;
  ImVec2 local_10;
  ImVec2 local_8;
  
  local_10.y = half_sz.y;
  local_18.x = pos.x;
  local_18.y = pos.y;
  if (direction == 0) {
    local_8.x = local_18.x + half_sz.x;
    local_8.y = local_18.y - local_10.y;
    local_10.y = local_10.y + local_18.y;
  }
  else {
    local_8.x = local_18.x - half_sz.x;
    local_8.y = local_10.y + local_18.y;
    local_10.y = local_18.y - local_10.y;
  }
  local_18 = pos;
  local_10.x = local_8.x;
  ImDrawList::AddTriangleFilled(draw_list,&local_8,&local_10,&local_18,col);
  return;
}

Assistant:

static void RenderArrow(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, ImGuiDir direction, ImU32 col)
{
    switch (direction)
    {
    case ImGuiDir_Left:  draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), pos, col); return;
    case ImGuiDir_Right: draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), pos, col); return;
    case ImGuiDir_Up:    draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), pos, col); return;
    case ImGuiDir_Down:  draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), pos, col); return;
    case ImGuiDir_None: case ImGuiDir_COUNT: break; // Fix warnings
    }
}